

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O3

void __thiscall duckdb::InFilter::InFilter(InFilter *this,vector<duckdb::Value,_true> *values_p)

{
  bool bVar1;
  reference this_00;
  reference rhs;
  pointer pVVar2;
  InternalException *pIVar3;
  pointer pVVar4;
  pointer pVVar5;
  size_type __n;
  string local_48;
  
  (this->super_TableFilter).filter_type = IN_FILTER;
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)&PTR__InFilter_024377e8;
  pVVar2 = (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVVar2;
  (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (values_p->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pVVar4 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pVVar5 = pVVar2; pVVar5 != pVVar4; pVVar5 = pVVar5 + 1) {
    if (pVVar5->is_null == true) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"InFilter constant cannot be NULL - use IsNullFilter instead",
                 "");
      InternalException::InternalException(pIVar3,&local_48);
      __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (0x40 < (ulong)((long)pVVar4 - (long)pVVar2)) {
    __n = 1;
    do {
      this_00 = vector<duckdb::Value,_true>::operator[](&this->values,0);
      rhs = vector<duckdb::Value,_true>::operator[](&this->values,__n);
      bVar1 = LogicalType::operator==(&this_00->type_,&rhs->type_);
      if (!bVar1) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"InFilter constants must all have the same type","");
        InternalException::InternalException(pIVar3,&local_48);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = __n + 1;
      pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar4 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (__n < (ulong)((long)pVVar4 - (long)pVVar2 >> 6));
  }
  if (pVVar2 != pVVar4) {
    return;
  }
  pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"InFilter constants cannot be empty","");
  InternalException::InternalException(pIVar3,&local_48);
  __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

InFilter::InFilter(vector<Value> values_p) : TableFilter(TableFilterType::IN_FILTER), values(std::move(values_p)) {
	for (auto &val : values) {
		if (val.IsNull()) {
			throw InternalException("InFilter constant cannot be NULL - use IsNullFilter instead");
		}
	}
	for (idx_t i = 1; i < values.size(); i++) {
		if (values[0].type() != values[i].type()) {
			throw InternalException("InFilter constants must all have the same type");
		}
	}
	if (values.empty()) {
		throw InternalException("InFilter constants cannot be empty");
	}
}